

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

bool __thiscall wasm::Literal::isNegative(Literal *this)

{
  byte bVar1;
  BasicType BVar2;
  
  BVar2 = wasm::Type::getBasic(&this->type);
  switch(BVar2) {
  case i32:
  case f32:
    bVar1 = (byte)((uint)(this->field_0).i32 >> 0x18);
    break;
  case i64:
  case f64:
    bVar1 = (byte)((this->field_0).func.super_IString.str._M_len >> 0x38);
    break;
  default:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                       ,0x8b);
  }
  return (bool)(bVar1 >> 7);
}

Assistant:

bool isNegative() const {
    switch (type.getBasic()) {
      case Type::i32:
      case Type::f32:
        return i32 < 0;
      case Type::i64:
      case Type::f64:
        return i64 < 0;
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }